

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_renumber.cc
# Opt level: O0

bool compare(QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  ulong uVar7;
  size_type sVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  size_type sVar12;
  size_type sVar13;
  reference pvVar14;
  pair<std::_Rb_tree_const_iterator<QPDFObjGen>,_bool> pVar15;
  QPDFObjectHandle local_218;
  QPDFObjectHandle local_208;
  reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_b;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_a;
  QPDFObjectHandle local_178;
  QPDFObjectHandle local_168;
  size_type local_158;
  size_t i;
  size_type local_148;
  size_t items;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> objs_b;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_128 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> objs_a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Base_ptr local_40;
  undefined1 local_38;
  value_type local_30;
  key_type local_28;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *b_local;
  QPDFObjectHandle *a_local;
  
  local_20 = b;
  b_local = a;
  if ((compare(QPDFObjectHandle,QPDFObjectHandle)::visited == '\0') &&
     (iVar4 = __cxa_guard_acquire(&compare(QPDFObjectHandle,QPDFObjectHandle)::visited), iVar4 != 0)
     ) {
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set(&compare::visited)
    ;
    __cxa_atexit(std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set,
                 &compare::visited,&__dso_handle);
    __cxa_guard_release(&compare(QPDFObjectHandle,QPDFObjectHandle)::visited);
  }
  uVar7 = QPDFObjectHandle::isIndirect();
  if ((uVar7 & 1) != 0) {
    local_28 = (key_type)QPDFObjectHandle::getObjGen();
    sVar8 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                      (&compare::visited,&local_28);
    if (sVar8 != 0) {
      a_local._7_1_ = 1;
      goto LAB_00106048;
    }
    local_30 = (value_type)QPDFObjectHandle::getObjGen();
    pVar15 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                       (&compare::visited,&local_30);
    local_40 = (_Base_ptr)pVar15.first._M_node;
    local_38 = pVar15.second;
  }
  iVar4 = QPDFObjectHandle::getTypeCode();
  iVar5 = QPDFObjectHandle::getTypeCode();
  if (iVar4 != iVar5) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"different type code");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    a_local._7_1_ = 0;
    goto LAB_00106048;
  }
  uVar6 = QPDFObjectHandle::getTypeCode();
  switch(uVar6) {
  case 2:
    break;
  case 3:
    bVar1 = QPDFObjectHandle::getBoolValue();
    bVar2 = QPDFObjectHandle::getBoolValue();
    if ((bVar1 & 1) != (bVar2 & 1)) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different boolean");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      goto LAB_00106048;
    }
    break;
  case 4:
    lVar10 = QPDFObjectHandle::getIntValue();
    lVar11 = QPDFObjectHandle::getIntValue();
    if (lVar10 != lVar11) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different integer");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      goto LAB_00106048;
    }
    break;
  case 5:
    QPDFObjectHandle::getRealValue_abi_cxx11_();
    QPDFObjectHandle::getRealValue_abi_cxx11_();
    bVar3 = std::operator!=(&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar3) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different real");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      goto LAB_00106048;
    }
    break;
  case 6:
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    bVar3 = std::operator!=(&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar3) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different string");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      goto LAB_00106048;
    }
    break;
  case 7:
    QPDFObjectHandle::getName_abi_cxx11_();
    QPDFObjectHandle::getName_abi_cxx11_();
    bVar3 = std::operator!=(&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    if (bVar3) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different name");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      goto LAB_00106048;
    }
    break;
  case 8:
    QPDFObjectHandle::getArrayAsVector();
    QPDFObjectHandle::getArrayAsVector();
    sVar12 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_128);
    local_148 = sVar12;
    sVar13 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&items);
    if (sVar12 == sVar13) {
      for (local_158 = 0; local_158 < local_148; local_158 = local_158 + 1) {
        pvVar14 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                            (local_128,local_158);
        QPDFObjectHandle::QPDFObjectHandle(&local_168,pvVar14);
        pvVar14 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&items,
                             local_158);
        QPDFObjectHandle::QPDFObjectHandle(&local_178,pvVar14);
        bVar3 = compare(&local_168,&local_178);
        QPDFObjectHandle::~QPDFObjectHandle(&local_178);
        QPDFObjectHandle::~QPDFObjectHandle(&local_168);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"different array item");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          a_local._7_1_ = 0;
          i._4_4_ = 1;
          goto LAB_00105d2a;
        }
      }
      i._4_4_ = 0;
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different array size");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      i._4_4_ = 1;
    }
LAB_00105d2a:
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&items);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(local_128);
    goto joined_r0x00105fd0;
  case 9:
    QPDFObjectHandle::getKeys_abi_cxx11_();
    QPDFObjectHandle::getKeys_abi_cxx11_();
    bVar3 = std::operator!=(local_1a8,
                            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range2);
    if (bVar3) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"different dictionary keys");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      a_local._7_1_ = 0;
      i._4_4_ = 1;
    }
    else {
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_1a8);
      key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(local_1a8);
      while (bVar3 = std::operator!=(&__end2,(_Self *)&key), bVar3) {
        local_1f8 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
        QPDFObjectHandle::getKey((string *)&local_208);
        QPDFObjectHandle::getKey((string *)&local_218);
        bVar3 = compare(&local_208,&local_218);
        QPDFObjectHandle::~QPDFObjectHandle(&local_218);
        QPDFObjectHandle::~QPDFObjectHandle(&local_208);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"different dictionary item");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          a_local._7_1_ = 0;
          i._4_4_ = 1;
          goto LAB_00105fb0;
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      i._4_4_ = 0;
    }
LAB_00105fb0:
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(local_1a8);
joined_r0x00105fd0:
    if (i._4_4_ != 0) goto LAB_00106048;
    break;
  case 10:
    poVar9 = std::operator<<((ostream *)&std::cout,"stream objects are not compared");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar9 = std::operator<<((ostream *)&std::cerr,"unknown object type");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  a_local._7_1_ = 1;
LAB_00106048:
  return (bool)(a_local._7_1_ & 1);
}

Assistant:

bool
compare(QPDFObjectHandle a, QPDFObjectHandle b)
{
    static std::set<QPDFObjGen> visited;
    if (a.isIndirect()) {
        if (visited.count(a.getObjGen())) {
            return true;
        }
        visited.insert(a.getObjGen());
    }

    if (a.getTypeCode() != b.getTypeCode()) {
        std::cerr << "different type code" << std::endl;
        return false;
    }

    switch (a.getTypeCode()) {
    case ::ot_boolean:
        if (a.getBoolValue() != b.getBoolValue()) {
            std::cerr << "different boolean" << std::endl;
            return false;
        }
        break;
    case ::ot_integer:
        if (a.getIntValue() != b.getIntValue()) {
            std::cerr << "different integer" << std::endl;
            return false;
        }
        break;
    case ::ot_real:
        if (a.getRealValue() != b.getRealValue()) {
            std::cerr << "different real" << std::endl;
            return false;
        }
        break;
    case ::ot_string:
        if (a.getStringValue() != b.getStringValue()) {
            std::cerr << "different string" << std::endl;
            return false;
        }
        break;
    case ::ot_name:
        if (a.getName() != b.getName()) {
            std::cerr << "different name" << std::endl;
            return false;
        }
        break;
    case ::ot_array:
        {
            std::vector<QPDFObjectHandle> objs_a = a.getArrayAsVector();
            std::vector<QPDFObjectHandle> objs_b = b.getArrayAsVector();
            size_t items = objs_a.size();
            if (items != objs_b.size()) {
                std::cerr << "different array size" << std::endl;
                return false;
            }

            for (size_t i = 0; i < items; ++i) {
                if (!compare(objs_a[i], objs_b[i])) {
                    std::cerr << "different array item" << std::endl;
                    return false;
                }
            }
        }
        break;
    case ::ot_dictionary:
        {
            std::set<std::string> keys_a = a.getKeys();
            std::set<std::string> keys_b = b.getKeys();
            if (keys_a != keys_b) {
                std::cerr << "different dictionary keys" << std::endl;
                return false;
            }

            for (auto const& key: keys_a) {
                if (!compare(a.getKey(key), b.getKey(key))) {
                    std::cerr << "different dictionary item" << std::endl;
                    return false;
                }
            }
        }
        break;
    case ::ot_null:
        break;
    case ::ot_stream:
        std::cout << "stream objects are not compared" << std::endl;
        break;
    default:
        std::cerr << "unknown object type" << std::endl;
        std::exit(2);
    }

    return true;
}